

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.h
# Opt level: O0

int __thiscall llbuild::basic::ProcessGroup::remove(ProcessGroup *this,char *__filename)

{
  int iVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  llbuild_pid_t pid_local;
  ProcessGroup *this_local;
  
  lock._M_device._4_4_ = SUB84(__filename,0);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::
  unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
  ::erase(&this->processes,(key_type *)((long)&lock._M_device + 4));
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  iVar1 = std::condition_variable::notify_all();
  return iVar1;
}

Assistant:

void remove(llbuild_pid_t pid) {
        {
          std::lock_guard<std::mutex> lock(mutex);
          processes.erase(pid);
        }
        processesCondition.notify_all();
      }